

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

void __thiscall bdQueryHistory::printMsgs(bdQueryHistory *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"bdQueryHistory::printMsgs() IncomingQueries in last ",0x34);
  std::ostream::operator<<(&std::cerr,this->mStorePeriod);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," secs",5);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  for (p_Var1 = (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->mHistory)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
    bdStdPrintId((ostream *)&std::cerr,(bdId *)(p_Var1 + 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    if (*(char *)&p_Var1[2]._M_parent == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," BadPeer",8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  return;
}

Assistant:

void bdQueryHistory::printMsgs() {
	std::ostream &out = std::cerr;

	out << "bdQueryHistory::printMsgs() IncomingQueries in last " << mStorePeriod;
	out << " secs" << std::endl;

	std::map<bdId, bdQueryHistoryList>::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); it++) {
		out << "\t";
		bdStdPrintId(out, &(it->first));
		out << " " << it->second.mList.size();
		if (it->second.mBadPeer)
			out << " BadPeer";
		out << std::endl;
	}
}